

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

int32_t __thiscall AmpIO::ReadWatchdogPeriod(AmpIO *this,bool applyMask)

{
  BasePort *pBVar1;
  uint uVar2;
  uint in_EAX;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  if (pBVar1 == (BasePort *)0x0) {
    uStack_18._4_4_ = 0;
  }
  else {
    (*pBVar1->_vptr_BasePort[0x23])
              (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,3,(long)&uStack_18 + 4);
  }
  uVar2 = uStack_18._4_4_ & 0xffff;
  if (!applyMask) {
    uVar2 = uStack_18._4_4_;
  }
  return uVar2;
}

Assistant:

int32_t AmpIO::ReadWatchdogPeriod(bool applyMask) const
{
    uint32_t counts = 0;
    if (port) {
        port->ReadQuadlet(BoardId, 3, counts);
    }
    if (applyMask)
        counts &= 0x0000ffff;
    return counts;
}